

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O2

bool __thiscall diffusion::Tokenizer::pop(Tokenizer *this,vector<char,_std::allocator<char>_> *data)

{
  vector<char,_std::allocator<char>_> *__x;
  vector<char,_std::allocator<char>_> *pvVar1;
  
  std::mutex::lock(&this->queue_mutex_);
  __x = (this->processed_data_queue_).
        super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pvVar1 = (this->processed_data_queue_).
           super__Deque_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pvVar1 != __x) {
    std::vector<char,_std::allocator<char>_>::operator=(data,__x);
    std::
    deque<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::pop_front(&this->processed_data_queue_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->queue_mutex_);
  return pvVar1 != __x;
}

Assistant:

bool pop(std::vector<char> &data) {
        std::lock_guard<std::mutex> lock(queue_mutex_);
        if (processed_data_queue_.empty()) {
            return false;
        } else {
            data = processed_data_queue_.front();
            processed_data_queue_.pop_front();
            return true;
        }
    }